

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

Engine * __thiscall
adios2::core::IO::Open(IO *this,string *name,Mode mode,Comm *comm,char *md,size_t mdsize)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *this_00;
  string *__rhs;
  size_type sVar1;
  Engine *pEVar2;
  bool bVar3;
  int iVar4;
  Mode MVar5;
  iterator iVar6;
  ulong uVar7;
  const_iterator cVar8;
  iterator iVar9;
  size_type sVar10;
  Comm *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_bool>
  pVar11;
  allocator local_153;
  allocator local_152;
  allocator local_151;
  string msg;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string engineTypeLC;
  shared_ptr<adios2::core::Engine> engine;
  Comm local_98;
  Comm local_90;
  Comm local_88;
  shared_ptr<adios2::core::Engine> engine_ptr;
  ScopedTimer __var2535;
  
  if ((Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
       ::__var535 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                                   ::__var535), iVar4 != 0)) {
    Open::__var535 = (void *)ps_timer_create_("IO::Open");
    __cxa_guard_release(&Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                         ::__var535);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2535,Open::__var535);
  this_00 = &this->m_Engines;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
          ::find(&this_00->_M_t,name);
  if ((_Rb_tree_header *)iVar6._M_node != &(this->m_Engines)._M_t._M_impl.super__Rb_tree_header) {
    bVar3 = Engine::operator_cast_to_bool(*(Engine **)(iVar6._M_node + 2));
    if (bVar3) {
      std::__cxx11::string::string((string *)&engineTypeLC,"Core",(allocator *)&engine_ptr);
      std::__cxx11::string::string((string *)&msg,"IO",(allocator *)&engine);
      std::__cxx11::string::string((string *)&local_130,"Open",&local_153);
      std::operator+(&local_110,"Engine ",name);
      std::operator+(&local_f0,&local_110," is opened twice");
      helper::Throw<std::invalid_argument>(&engineTypeLC,&msg,&local_130,&local_f0,-1);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::~string((string *)&engineTypeLC);
    }
    else {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
      ::erase(&this_00->_M_t,name);
    }
  }
  engine.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  engine.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __rhs = &this->m_EngineType;
  sVar1 = (this->m_EngineType)._M_string_length;
  std::__cxx11::string::string((string *)&engineTypeLC,(string *)__rhs);
  if (sVar1 != 0) {
    for (sVar10 = 0; engineTypeLC._M_string_length != sVar10; sVar10 = sVar10 + 1) {
      iVar4 = tolower((int)engineTypeLC._M_dataplus._M_p[sVar10]);
      engineTypeLC._M_dataplus._M_p[sVar10] = (char)iVar4;
    }
  }
  bVar3 = std::operator==(&engineTypeLC,"file");
  if ((((bVar3) || (bVar3 = std::operator==(&engineTypeLC,"bpfile"), bVar3)) ||
      (bVar3 = std::operator==(&engineTypeLC,"bp"), sVar1 == 0)) || (bVar3)) {
    std::__cxx11::string::string((string *)&msg,".h5",(allocator *)&local_130);
    bVar3 = helper::EndsWith(name,&msg,false);
    std::__cxx11::string::~string((string *)&msg);
    if (!bVar3) {
      std::__cxx11::string::string((string *)&msg,".aca",(allocator *)&local_130);
      bVar3 = helper::EndsWith(name,&msg,false);
      std::__cxx11::string::~string((string *)&msg);
      if ((!bVar3) && ((mode == ReadRandomAccess || (mode == Read)))) {
        bVar3 = adios2sys::SystemTools::FileIsDirectory(name);
        if (bVar3) {
          helper::BPVersion(name,comm,&this->m_TransportsParameters);
          std::__cxx11::string::assign((char *)&engineTypeLC);
          std::__cxx11::string::push_back((char)&engineTypeLC);
          goto LAB_00407836;
        }
        std::operator+(&msg,name,".tier0");
        bVar3 = adios2sys::SystemTools::FileIsDirectory(&msg);
        std::__cxx11::string::~string((string *)&msg);
        if (!bVar3) {
          std::__cxx11::string::string((string *)&msg,".bp",(allocator *)&local_130);
          bVar3 = helper::EndsWith(name,&msg,false);
          std::__cxx11::string::~string((string *)&msg);
          if (!bVar3) {
            helper::IsHDF5File(name,this,comm,&this->m_TransportsParameters);
          }
        }
      }
    }
    std::__cxx11::string::assign((char *)&engineTypeLC);
  }
LAB_00407836:
  bVar3 = std::operator==(&engineTypeLC,"filestream");
  if (bVar3) {
    helper::BPVersion(name,comm,&this->m_TransportsParameters);
    std::__cxx11::string::assign((char *)&engineTypeLC);
    std::__cxx11::string::push_back((char)&engineTypeLC);
  }
  bVar3 = std::operator==(&engineTypeLC,"inline");
  if (!bVar3) goto LAB_00407c59;
  if (mode == Sync) {
    std::__cxx11::string::string((string *)&msg,"Core",(allocator *)&engine_ptr);
    std::__cxx11::string::string((string *)&local_130,"IO",&local_153);
    std::__cxx11::string::string((string *)&local_f0,"Open",&local_152);
    std::__cxx11::string::string
              ((string *)&local_110,"Sync mode is not supported in the inline engine.",&local_151);
    helper::Throw<std::runtime_error>(&msg,&local_130,&local_f0,&local_110,-1);
LAB_004079a8:
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&msg);
  }
  else if (mode == Append) {
    std::__cxx11::string::string((string *)&msg,"Core",(allocator *)&engine_ptr);
    std::__cxx11::string::string((string *)&local_130,"IO",&local_153);
    std::__cxx11::string::string((string *)&local_f0,"Open",&local_152);
    std::__cxx11::string::string
              ((string *)&local_110,"Append mode is not supported in the inline engine.",&local_151)
    ;
    helper::Throw<std::runtime_error>(&msg,&local_130,&local_f0,&local_110,-1);
    goto LAB_004079a8;
  }
  uVar7 = (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (1 < uVar7) {
    std::operator+(&local_110,"Failed to add engine ",name);
    std::operator+(&local_f0,&local_110," to IO \'");
    std::operator+(&local_130,&local_f0,&this->m_Name);
    std::operator+(&msg,&local_130,"\'. ");
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::append((char *)&msg);
    std::__cxx11::string::append((char *)&msg);
    std::__cxx11::string::string((string *)&local_130,"Core",(allocator *)&engine_ptr);
    std::__cxx11::string::string((string *)&local_f0,"IO",&local_153);
    std::__cxx11::string::string((string *)&local_110,"Open",&local_152);
    helper::Throw<std::runtime_error>(&local_130,&local_f0,&local_110,&msg,-1);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&msg);
    uVar7 = (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  if (uVar7 == 1) {
    std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&engine_ptr.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> *)
               ((this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2));
    MVar5 = Engine::OpenMode(engine_ptr.
                             super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
    if (MVar5 == mode) {
      std::operator+(&local_110,"The previously added engine ",
                     &(engine_ptr.
                       super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->m_Name);
      std::operator+(&local_f0,&local_110," is already opened in same mode requested for ");
      std::operator+(&local_130,&local_f0,name);
      std::operator+(&msg,&local_130,". ");
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::append((char *)&msg);
      std::__cxx11::string::string((string *)&local_130,"Core",&local_153);
      std::__cxx11::string::string((string *)&local_f0,"IO",&local_152);
      std::__cxx11::string::string((string *)&local_110,"Open",&local_151);
      helper::Throw<std::runtime_error>(&local_130,&local_f0,&local_110,&msg,-1);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&engine_ptr.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
LAB_00407c59:
  if (mode == ReadRandomAccess) {
    cVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(anonymous_namespace)::ReadRandomAccess_Supported_abi_cxx11_,&engineTypeLC);
    if (cVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
        ._M_cur == (__node_type *)0x0) {
      mode = ReadRandomAccess;
    }
    else {
      mode = (uint)*(byte *)((long)cVar8.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                                   ._M_cur + 0x28) * 2 + Read;
    }
  }
  std::mutex::lock((mutex *)(anonymous_namespace)::FactoryMutex);
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(anonymous_namespace)::Factory_abi_cxx11_,&engineTypeLC);
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::FactoryMutex);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::string::string((string *)&msg,"Core",&local_153);
    std::__cxx11::string::string((string *)&local_130,"IO",&local_152);
    std::__cxx11::string::string((string *)&local_f0,"Open",&local_151);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&engine_ptr,
                   "Engine type ",__rhs);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&engine_ptr,
                   " is not valid");
    helper::Throw<std::invalid_argument>(&msg,&local_130,&local_f0,&local_110,-1);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&engine_ptr);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    MVar5 = (Mode)name;
    if ((md == (char *)0x0) || (mode != ReadRandomAccess)) {
      if ((mode == ReadRandomAccess) || (mode == Read)) {
        helper::Comm::Comm(&local_90,comm);
        std::
        function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
        ::operator()((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
                      *)&msg,(IO *)((long)iVar9.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                                          ._M_cur + 0x28),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,MVar5
                     ,(Comm *)(ulong)mode);
        std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&engine.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> *)&msg);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&msg._M_string_length);
        this_01 = &local_90;
      }
      else {
        helper::Comm::Comm(&local_98,comm);
        std::
        function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
        ::operator()((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
                      *)&msg,(IO *)((long)iVar9.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                                          ._M_cur + 0x48),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,MVar5
                     ,(Comm *)(ulong)mode);
        std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&engine.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> *)&msg);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&msg._M_string_length);
        this_01 = &local_98;
      }
    }
    else {
      helper::Comm::Comm(&local_88,comm);
      std::
      function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
      ::operator()((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
                    *)&msg,(IO *)((long)iVar9.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                                        ._M_cur + 0x68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,MVar5,
                   (Comm *)0x4,(char *)&local_88,(unsigned_long)md);
      std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&engine.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> *)&msg);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&msg._M_string_length);
      this_01 = &local_88;
    }
    helper::Comm::~Comm(this_01);
  }
  pVar11 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
           ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<adios2::core::Engine>>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
                       *)this_00,name,&engine);
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::string::string((string *)&msg,"Core",(allocator *)&engine_ptr);
    std::__cxx11::string::string((string *)&local_130,"IO",&local_153);
    std::__cxx11::string::string((string *)&local_f0,"Open",&local_152);
    std::operator+(&local_110,"failed to create Engine ",__rhs);
    helper::Throw<std::invalid_argument>(&msg,&local_130,&local_f0,&local_110,-1);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&msg);
  }
  pEVar2 = *(Engine **)(pVar11.first._M_node._M_node + 2);
  std::__cxx11::string::~string((string *)&engineTypeLC);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&engine.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2535);
  return pEVar2;
}

Assistant:

Engine &IO::Open(const std::string &name, const Mode mode, helper::Comm comm, const char *md,
                 const size_t mdsize)
{
    PERFSTUBS_SCOPED_TIMER("IO::Open");
    auto itEngineFound = m_Engines.find(name);
    const bool isEngineFound = (itEngineFound != m_Engines.end());
    bool isEngineActive = false;
    Mode mode_to_use = mode;

    if (isEngineFound)
    {
        if (*itEngineFound->second)
        {
            isEngineActive = true;
        }
    }

    if (isEngineFound)
    {
        if (isEngineActive) // check if active
        {
            helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                                 "Engine " + name + " is opened twice");
        }
    }

    if (isEngineFound)
    {
        if (!isEngineActive)
        {
            m_Engines.erase(name);
        }
    }

    std::shared_ptr<Engine> engine;
    const bool isDefaultEngine = m_EngineType.empty() ? true : false;
    std::string engineTypeLC = m_EngineType;
    if (!isDefaultEngine)
    {
        std::transform(engineTypeLC.begin(), engineTypeLC.end(), engineTypeLC.begin(), ::tolower);
    }

    /* Second step in handling virtual engines */
    /* BPFile for read needs to use BP5, BP4, or BP3 depending on the file's
     * version
     */
    if ((engineTypeLC == "file" || engineTypeLC == "bpfile" || engineTypeLC == "bp" ||
         isDefaultEngine))
    {
        if (helper::EndsWith(name, ".h5", false))
        {
            engineTypeLC = "hdf5";
        }
        else if (helper::EndsWith(name, ".aca", false))
        {
            engineTypeLC = "campaign";
        }
        else if ((mode_to_use == Mode::Read) || (mode_to_use == Mode::ReadRandomAccess))
        {
            if (adios2sys::SystemTools::FileIsDirectory(name))
            {
                char v = helper::BPVersion(name, comm, m_TransportsParameters);
                engineTypeLC = "bp";
                engineTypeLC.push_back(v);
            }
            else if (adios2sys::SystemTools::FileIsDirectory(name + ".tier0"))
            {
                engineTypeLC = "mhs";
            }
            else
            {
                if (helper::EndsWith(name, ".bp", false))
                {
                    engineTypeLC = "bp3";
                }
                else
                {
                    /* We need to figure out the type of file
                     * from the file itself
                     */
                    if (helper::IsHDF5File(name, *this, comm, m_TransportsParameters))
                    {
                        engineTypeLC = "hdf5";
                    }
                    else
                    {
                        engineTypeLC = "bp3";
                    }
                }
            }
        }
        else
        {
            // File default for writing: BP5
            engineTypeLC = "bp5";
        }
    }

    /* Note: Mismatch between BP4/BP5 writer and FileStream reader is not
       handled if writer has not created the directory yet, when FileStream
       falls back to default (BP4) */
    if (engineTypeLC == "filestream")
    {
        char v = helper::BPVersion(name, comm, m_TransportsParameters);
        engineTypeLC = "bp";
        engineTypeLC.push_back(v);
        // std::cout << "Engine " << engineTypeLC << " selected for FileStream"
        //          << std::endl;
    }

    // For the inline engine, there must be exactly 1 reader, and exactly 1
    // writer.
    if (engineTypeLC == "inline")
    {
        if (mode_to_use == Mode::Append)
        {
            helper::Throw<std::runtime_error>("Core", "IO", "Open",
                                              "Append mode is not supported in the inline engine.");
        }

        // See inline.rst:44
        if (mode_to_use == Mode::Sync)
        {
            helper::Throw<std::runtime_error>("Core", "IO", "Open",
                                              "Sync mode is not supported in the inline engine.");
        }

        if (m_Engines.size() >= 2)
        {
            std::string msg = "Failed to add engine " + name + " to IO \'" + m_Name + "\'. ";
            msg += "An inline engine must have exactly one writer, and one "
                   "reader. ";
            msg += "There are already two engines declared, so no more can be "
                   "added.";
            helper::Throw<std::runtime_error>("Core", "IO", "Open", msg);
        }
        // Now protect against declaration of two writers, or declaration of
        // two readers:
        if (m_Engines.size() == 1)
        {
            auto engine_ptr = m_Engines.begin()->second;
            if (engine_ptr->OpenMode() == mode_to_use)
            {
                std::string msg = "The previously added engine " + engine_ptr->m_Name +
                                  " is already opened in same mode requested for " + name + ". ";
                msg += "The inline engine requires exactly one writer and one "
                       "reader.";
                helper::Throw<std::runtime_error>("Core", "IO", "Open", msg);
            }
        }
    }

    if (mode_to_use == Mode::ReadRandomAccess)
    {
        // older engines don't know about ReadRandomAccess Mode
        auto it = ReadRandomAccess_Supported.find(engineTypeLC);
        if (it != ReadRandomAccess_Supported.end())
        {
            if (!it->second)
            {
                mode_to_use = Mode::Read;
            }
        }
    }

    auto f = FactoryLookup(engineTypeLC);
    if (f != Factory.end())
    {
        if (md && mode_to_use == Mode::ReadRandomAccess)
        {
            engine =
                f->second.MakeReaderWithMD(*this, name, mode_to_use, std::move(comm), md, mdsize);
        }
        else if ((mode_to_use == Mode::Read) || (mode_to_use == Mode::ReadRandomAccess))
        {
            engine = f->second.MakeReader(*this, name, mode_to_use, std::move(comm));
        }
        else
        {
            engine = f->second.MakeWriter(*this, name, mode_to_use, std::move(comm));
        }
    }
    else
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                             "Engine type " + m_EngineType + " is not valid");
    }

    auto itEngine = m_Engines.emplace(name, std::move(engine));

    if (!itEngine.second)
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                             "failed to create Engine " + m_EngineType);
    }
    // return a reference
    return *itEngine.first->second.get();
}